

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O3

void __thiscall irr::gui::CGUITab::draw(CGUITab *this)

{
  char cVar1;
  long *plVar2;
  undefined8 *puVar3;
  
  if (this->field_0xa0 == '\x01') {
    plVar2 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    if ((plVar2 != (long *)0x0) && (this->DrawBackground == true)) {
      (**(code **)(*plVar2 + 0xa8))
                (plVar2,this,&this->BackColor,&this->field_0x40,&this->field_0x50);
    }
    cVar1 = (**(code **)(*(long *)this + 0x68))(this);
    if (cVar1 != '\0') {
      for (puVar3 = *(undefined8 **)&this->field_0x8; puVar3 != (undefined8 *)&this->field_0x8;
          puVar3 = (undefined8 *)*puVar3) {
        (**(code **)(*(long *)puVar3[2] + 0x50))();
      }
    }
  }
  return;
}

Assistant:

void CGUITab::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	if (skin && DrawBackground)
		skin->draw2DRectangle(this, BackColor, AbsoluteRect, &AbsoluteClippingRect);

	IGUIElement::draw();
}